

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeCallRef
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType type,bool isReturn)

{
  bool bVar1;
  size_t size;
  CallRef *expr;
  optional<wasm::HeapType> ht;
  Signature SVar2;
  undefined1 local_c8 [8];
  CallRef curr;
  ChildPopper local_80 [4];
  _Storage<wasm::HeapType,_true> local_60;
  HeapType type_local;
  Result<wasm::Ok> _val;
  
  curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = (size_t)&this->wasm->allocator;
  local_c8[0] = CallRefId;
  curr.super_SpecificExpression<(wasm::Expression::Id)61>.super_Expression._id = InvalidId;
  curr.super_SpecificExpression<(wasm::Expression::Id)61>.super_Expression._1_7_ = 0;
  curr.super_SpecificExpression<(wasm::Expression::Id)61>.super_Expression.type.id = 0;
  curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  curr.target._0_1_ = 0;
  local_60 = (_Storage<wasm::HeapType,_true>)type.id;
  bVar1 = HeapType::isSignature(&local_60._M_value);
  if (bVar1) {
    SVar2 = HeapType::getSignature(&local_60._M_value);
    curr._56_8_ = SVar2.results.id;
    _type_local = (undefined1  [16])HeapType::getSignature(&local_60._M_value);
    size = wasm::Type::size((Type *)&type_local);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               &curr.super_SpecificExpression<(wasm::Expression::Id)61>.super_Expression.type,size);
    ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
    ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
         (HeapType)(HeapType)local_60;
    local_80[0].builder = this;
    ChildPopper::visitCallRef((Result<wasm::Ok> *)&type_local,local_80,(CallRef *)local_c8,ht);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string((string *)local_80,(string *)&type_local);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_80);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&type_local);
      anon_unknown_283::validateTypeAnnotation
                ((Result<wasm::Ok> *)&type_local,local_60._M_value.id,
                 (Expression *)curr.operands.allocator);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&type_local);
        expr = Builder::makeCallRef<ArenaVector<wasm::Expression*>>
                         (&this->builder,(Expression *)curr.operands.allocator,
                          (ArenaVector<wasm::Expression_*> *)
                          &curr.super_SpecificExpression<(wasm::Expression::Id)61>.super_Expression.
                           type,(Type)curr._56_8_,isReturn);
        push(this,(Expression *)expr);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string((string *)local_80,(string *)&type_local);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_80);
    }
    std::__cxx11::string::~string((string *)local_80);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&type_local);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type_local,"expected function type",(allocator<char> *)local_80);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeCallRef(HeapType type, bool isReturn) {
  CallRef curr(wasm.allocator);
  if (!type.isSignature()) {
    return Err{"expected function type"};
  }
  auto sig = type.getSignature();
  curr.operands.resize(type.getSignature().params.size());
  CHECK_ERR(ChildPopper{*this}.visitCallRef(&curr, type));
  CHECK_ERR(validateTypeAnnotation(type, curr.target));
  push(builder.makeCallRef(curr.target, curr.operands, sig.results, isReturn));
  return Ok{};
}